

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lumeview.cpp
# Opt level: O2

void __thiscall lumeview::Lumeview::process_gui(Lumeview *this)

{
  Scene *this_00;
  bool bVar1;
  AppLog *this_01;
  
  ImGui_NewFrame();
  bVar1 = ImGui::BeginMainMenuBar();
  if (bVar1) {
    bVar1 = ImGui::BeginMenu("Panels",true);
    if (bVar1) {
      ImGui::MenuItem("Show Visualization",(char *)0x0,&this->m_guiShowScene,true);
      ImGui::MenuItem("Show Log",(char *)0x0,&this->m_guiShowLog,true);
      ImGui::MenuItem("Show ImGui Demo",(char *)0x0,&this->m_guiShowDemo,true);
      ImGui::EndMenu();
    }
    ImGui::EndMainMenuBar();
  }
  if (this->m_guiShowLog == true) {
    this_01 = DefLog();
    AppLog::draw(this_01,"log",&this->m_guiShowLog);
  }
  if (this->m_guiShowDemo == true) {
    ImGui::ShowDemoWindow(&this->m_guiShowDemo);
  }
  if ((this->m_guiShowScene == true) &&
     (this_00 = (this->m_scene).super___shared_ptr<lumeview::Scene,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr, this_00 != (Scene *)0x0)) {
    Scene::do_imgui(this_00,&this->m_guiShowScene);
  }
  ImGui::Render();
  MessageQueue::dispatch();
  return;
}

Assistant:

void Lumeview::process_gui ()
{
	lumeview::ImGui_NewFrame();

    if (ImGui::BeginMainMenuBar())
    {
        if (ImGui::BeginMenu("Panels"))
        {
            ImGui::MenuItem("Show Visualization", NULL, &m_guiShowScene);
            ImGui::MenuItem("Show Log", NULL, &m_guiShowLog);
            ImGui::MenuItem("Show ImGui Demo", NULL, &m_guiShowDemo);
            ImGui::EndMenu();
        }
        ImGui::EndMainMenuBar();
    }

	if (m_guiShowLog)
		DefLog().draw("log", &m_guiShowLog);

	if (m_guiShowDemo)
		ImGui::ShowDemoWindow (&m_guiShowDemo);

	if (m_guiShowScene && m_scene)
		m_scene->do_imgui (&m_guiShowScene);

	ImGui::Render();

	MessageQueue::dispatch ();
}